

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O1

void TTD::NSLogEvents::JsRTCallFunctionAction_UnloadSnapshot(EventLogEntry *evt)

{
  SnapShot *this;
  
  if (evt->EventKind == CallExistingFunctionActionTag) {
    if (((undefined8 *)evt[3].EventTimeStamp != (undefined8 *)0x0) &&
       (this = *(SnapShot **)evt[3].EventTimeStamp, this != (SnapShot *)0x0)) {
      SnapShot::~SnapShot(this);
      Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,this,0x1f8);
      *(undefined8 *)evt[3].EventTimeStamp = 0;
    }
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void JsRTCallFunctionAction_UnloadSnapshot(EventLogEntry* evt)
        {
            JsRTCallFunctionAction* cfAction = GetInlineEventDataAs<JsRTCallFunctionAction, EventKind::CallExistingFunctionActionTag>(evt);

            if(cfAction->AdditionalReplayInfo != nullptr && cfAction->AdditionalReplayInfo->RtRSnap != nullptr)
            {
                TT_HEAP_DELETE(SnapShot, cfAction->AdditionalReplayInfo->RtRSnap);
                cfAction->AdditionalReplayInfo->RtRSnap = nullptr;
            }
        }